

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O2

void __thiscall rbf_tests::rbf_helper_functions::test_method(rbf_helper_functions *this)

{
  long lVar1;
  CTxMemPool *this_00;
  pointer pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  uint256 *puVar8;
  element_type *peVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined7 uVar14;
  undefined7 uVar15;
  undefined7 uVar16;
  undefined7 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  char cVar21;
  undefined7 uVar22;
  undefined7 uVar23;
  undefined7 uVar24;
  undefined7 uVar25;
  bool bVar26;
  int32_t iVar27;
  uint32_t uVar28;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar29;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var30;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var31;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  this_01;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  this_02;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  this_03;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var32;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var33;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var34;
  CScript *this_04;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar35;
  long lVar36;
  pointer pCVar37;
  iterator pvVar38;
  iterator pvVar39;
  CMutableTransaction *pCVar40;
  CAmount *pCVar41;
  TestMemPoolEntryHelper *pTVar42;
  CMutableTransaction *pCVar43;
  ulong uVar44;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<long> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<long> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<long> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<long> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<long> __l_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_09;
  initializer_list<long> __l_10;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_11;
  initializer_list<long> __l_12;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_13;
  initializer_list<long> __l_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_15;
  initializer_list<long> __l_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_17;
  initializer_list<long> __l_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_19;
  initializer_list<long> __l_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_21;
  initializer_list<long> __l_22;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_23;
  initializer_list<long> __l_24;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_25;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_26;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_27;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_28;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_29;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_30;
  const_string file_11;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_31;
  const_string file_12;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_32;
  const_string file_13;
  const_string file_14;
  initializer_list<transaction_identifier<false>_> __l_33;
  const_string file_15;
  initializer_list<transaction_identifier<false>_> __l_34;
  const_string file_16;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_35;
  initializer_list<transaction_identifier<false>_> __l_36;
  const_string file_17;
  initializer_list<transaction_identifier<false>_> __l_37;
  const_string file_18;
  initializer_list<transaction_identifier<false>_> __l_38;
  const_string file_19;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_39;
  initializer_list<transaction_identifier<false>_> __l_40;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_41;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_42;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_43;
  initializer_list<long> __l_44;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_45;
  initializer_list<long> __l_46;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_47;
  const_string file_44;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_48;
  initializer_list<long> __l_49;
  const_string file_45;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_50;
  const_string file_46;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_51;
  initializer_list<long> __l_52;
  const_string file_47;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_53;
  const_string file_48;
  const_string file_49;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_54;
  const_string file_50;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_55;
  const_string file_51;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_56;
  const_string file_52;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_57;
  const_string file_53;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_58;
  const_string file_54;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_59;
  const_string file_55;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_60;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_61;
  initializer_list<long> __l_62;
  const_string file_56;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_63;
  const_string file_57;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_64;
  const_string file_58;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_65;
  initializer_list<long> __l_66;
  const_string file_59;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_67;
  const_string file_60;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_68;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar45;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar46;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar47;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar48;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar49;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar50;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar51;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar52;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar53;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar54;
  CAmount *pCVar55;
  size_type *psVar56;
  char *local_1280;
  char *local_1278;
  undefined1 *local_1270;
  undefined1 *local_1268;
  char *local_1260;
  char *local_1258;
  undefined1 local_1249 [33];
  char *local_1228;
  char *local_1220;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_1218;
  char *local_1208;
  char *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11d8;
  char *local_11d0;
  undefined1 *local_11c8;
  undefined1 *local_11c0;
  char *local_11b8;
  char *local_11b0;
  char *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  undefined1 *local_1190;
  char *local_1188;
  char *local_1180;
  CTransactionRef two_parent_child_tx;
  char *local_1168;
  char *local_1160;
  undefined1 *local_1158;
  undefined1 *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  undefined1 *local_1128;
  undefined1 *local_1120;
  char *local_1118;
  char *local_1110;
  CTransactionRef grand_child_tx;
  char *local_10f8;
  char *local_10f0;
  undefined1 *local_10e8;
  undefined1 *local_10e0;
  char *local_10d8;
  char *local_10d0;
  char *local_10c8;
  char *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  char *local_10a0;
  CTransactionRef child_tx;
  char *local_1088;
  char *local_1080;
  undefined1 *local_1078;
  undefined1 *local_1070;
  char *local_1068;
  char *local_1060;
  char *local_1058;
  char *local_1050;
  undefined1 *local_1048;
  undefined1 *local_1040;
  char *local_1038;
  char *local_1030;
  rbf_tests local_1028 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1020;
  char *local_1018;
  char *local_1010;
  undefined1 *local_1008;
  undefined1 *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  undefined1 local_fd8 [32];
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  CTransactionRef spends_conflicting_confirmed;
  char *local_f78;
  char *local_f70;
  undefined1 *local_f68;
  undefined1 *local_f60;
  char *local_f58;
  char *local_f50;
  char *local_f48;
  char *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  char *local_f28;
  char *local_f20;
  CTransactionRef spends_new_unconfirmed;
  char *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  undefined1 *local_ec8;
  undefined1 *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  char *local_e58;
  char *local_e50;
  CTransactionRef spends_unconfirmed;
  char *local_e38;
  char *local_e30;
  undefined1 *local_e28;
  undefined1 *local_e20;
  char *local_e18;
  char *local_e10;
  rbf_tests local_e08 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e00;
  char *local_df8;
  char *local_df0;
  undefined1 *local_de8;
  undefined1 *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  char *local_d90;
  undefined1 *local_d88;
  undefined1 *local_d80;
  char *local_d78;
  char *local_d70;
  rbf_tests local_d68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  rbf_tests local_cf8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  rbf_tests local_c88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c80;
  char *local_c78;
  char *local_c70;
  undefined1 *local_c68;
  undefined1 *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  char *local_c20;
  rbf_tests local_c18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c10;
  size_type conflicts_size;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  CTransactionRef conflicts_with_parents;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  parent_inputs;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  CFeeRate local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  CFeeRate local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  CFeeRate local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  CFeeRate local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  CFeeRate local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  CFeeRate local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  CFeeRate local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  CTransactionRef tx13;
  CTransactionRef tx12;
  CTransactionRef tx11;
  CTransactionRef tx10;
  CTransactionRef tx9;
  CTransactionRef tx8;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CAmount high_fee;
  CAmount normal_fee;
  CAmount low_fee;
  TestMemPoolEntryHelper entry;
  undefined1 local_469;
  undefined1 local_468 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_430 [3];
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_418;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_410;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_408;
  CScriptWitness witness;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_3d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3d0;
  CTransactionRef CStack_3c8;
  setEntries all_conflicts;
  setEntries all_children;
  setEntries all_parents;
  uint256 unused_txid;
  setEntries empty_set;
  setEntries all_entries;
  setEntries set_78_high;
  setEntries set_56_low;
  setEntries set_34_cpfp;
  setEntries set_12_normal;
  CMutableTransaction tx1_1;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_1a0 [13];
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_d0;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  TestMemPoolEntryHelper entry_1;
  CMutableTransaction tx2_1;
  
  local_1030 = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar29 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                       ,0x75,"test_method","m_node.mempool");
  this_00 = (puVar29->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
             ,0x76,false);
  pvVar38 = (iterator)0x76;
  pvVar39 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
             ,0x76,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  low_fee = 10000;
  normal_fee = 100000;
  high_fee = 1000000;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &((this->super_TestChain100Setup).m_coinbase_txns.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = &DAT_3b9aca00;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_00,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx1,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_01,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_02,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx2,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_03,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x418168c0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_04,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx3,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_05,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_06,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx4,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_07,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x418168c0;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_08,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx5,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_09,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x41722680;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_10,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx6,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._1_7_ = 0x5f5e1;
  CTxMemPool::PrioritiseTransaction
            (this_00,&((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped,(CAmount *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_11,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_12,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx7,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[4].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_13,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_14,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx8,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx8);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[5].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_15,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_16,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx9,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx9);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_17._M_len = 1;
  __l_17._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_17,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_18,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx10,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx10);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[7].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_19._M_len = 1;
  __l_19._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_19,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_20._M_len = 1;
  __l_20._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_20,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx11,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx11);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[8].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_21._M_len = 1;
  __l_21._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_21,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_22._M_len = 1;
  __l_22._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_22,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx12,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx12);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&tx2_1,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start[9].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  __l_23._M_len = 1;
  __l_23._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_23,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 995000000;
  set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_24,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx13,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish);
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx13);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
  oVar45 = CTxMemPool::GetIter(this_00,&((tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->hash).m_wrapped);
  _Var30 = oVar45.
           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
           ._M_payload;
  if (((undefined1  [16])
       oVar45.
       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
       ._M_payload.
       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
      & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    oVar46 = CTxMemPool::GetIter(this_00,&((tx2.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->hash).m_wrapped);
    _Var31 = oVar46.
             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
             ._M_payload;
    if (((undefined1  [16])
         oVar46.
         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      oVar47 = CTxMemPool::GetIter(this_00,&((tx3.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->hash).m_wrapped);
      if (((undefined1  [16])
           oVar47.
           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        oVar48 = CTxMemPool::GetIter(this_00,&((tx4.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->hash).m_wrapped);
        this_01 = oVar48.
                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                  ._M_payload;
        if (((undefined1  [16])
             oVar48.
             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          oVar49 = CTxMemPool::GetIter(this_00,&((tx5.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->hash).m_wrapped);
          this_02 = oVar49.
                    super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                    ._M_payload;
          if (((undefined1  [16])
               oVar49.
               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            oVar50 = CTxMemPool::GetIter(this_00,&((tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
            this_03 = oVar50.
                      super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                      ._M_payload;
            if (((undefined1  [16])
                 oVar50.
                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              oVar51 = CTxMemPool::GetIter(this_00,&((tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
              if (((undefined1  [16])
                   oVar51.
                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                  & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                oVar52 = CTxMemPool::GetIter(this_00,&((tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                if (((undefined1  [16])
                     oVar52.
                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                    & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  oVar53 = CTxMemPool::GetIter(this_00,&((tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                  _Var32 = oVar53.
                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                           ._M_payload;
                  if (((undefined1  [16])
                       oVar53.
                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                      & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    oVar53 = CTxMemPool::GetIter(this_00,&((tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                    _Var33 = oVar53.
                             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                             ._M_payload;
                    if (((undefined1  [16])
                         oVar53.
                         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      oVar53 = CTxMemPool::GetIter(this_00,&((tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                      _Var34 = oVar53.
                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                               ._M_payload;
                      if (((undefined1  [16])
                           oVar53.
                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        oVar53 = CTxMemPool::GetIter(this_00,&((tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                        if (((undefined1  [16])
                             oVar53.
                             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          oVar54 = CTxMemPool::GetIter(this_00,&((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                          if (((undefined1  [16])
                               oVar54.
                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                              std::__throw_bad_optional_access();
                            }
                          }
                          else {
                            local_5b0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_5a8 = "";
                            local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg.m_end = pvVar39;
                            msg.m_begin = pvVar38;
                            file.m_end = (iterator)0xb6;
                            file.m_begin = (iterator)&local_5b0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                                       (size_t)&local_5c0,msg);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_5d0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_5c8 = "";
                            pCVar41 = (CAmount *)(_Var30.field2 + 0x70);
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_5d0,0xb6,1,2,pCVar41,"entry1_normal->GetFee()",
                                       &normal_fee,"normal_fee");
                            local_5e0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_5d8 = "";
                            local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_00.m_end = (iterator)pCVar41;
                            msg_00.m_begin = pvVar38;
                            file_00.m_end = (iterator)0xb7;
                            file_00.m_begin = (iterator)&local_5e0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_00,(size_t)&local_5f0,msg_00);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_600 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_5f8 = "";
                            pvVar38 = (iterator)(_Var31.field2 + 0x70);
                            pvVar39 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_600,0xb7,1,2,pvVar38,"entry2_normal->GetFee()",
                                       &normal_fee,"normal_fee");
                            local_610 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_608 = "";
                            local_620 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_618 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_01.m_end = pvVar38;
                            msg_01.m_begin = pvVar39;
                            file_01.m_end = (iterator)0xb8;
                            file_01.m_begin = (iterator)&local_610;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_01,(size_t)&local_620,msg_01);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_630 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_628 = "";
                            pvVar38 = (iterator)
                                      (oVar47.
                                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                       ._M_payload.field2 + 0x70);
                            pvVar39 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_630,0xb8,1,2,pvVar38,"entry3_low->GetFee()",
                                       &low_fee,"low_fee");
                            local_640 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_638 = "";
                            local_650 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_648 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_02.m_end = pvVar38;
                            msg_02.m_begin = pvVar39;
                            file_02.m_end = (iterator)0xb9;
                            file_02.m_begin = (iterator)&local_640;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_02,(size_t)&local_650,msg_02);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_660 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_658 = "";
                            pCVar41 = (CAmount *)(this_01.field2 + 0x70);
                            pCVar55 = &high_fee;
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_660,0xb9,1,2,pCVar41,"entry4_high->GetFee()",
                                       pCVar55,"high_fee");
                            local_670 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_668 = "";
                            local_680 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_678 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_03.m_end = (iterator)pCVar41;
                            msg_03.m_begin = pvVar38;
                            file_03.m_end = (iterator)0xba;
                            file_03.m_begin = (iterator)&local_670;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_03,(size_t)&local_680,msg_03);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_690 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_688 = "";
                            pCVar41 = (CAmount *)(this_02.field2 + 0x70);
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_690,0xba,1,2,pCVar41,"entry5_low->GetFee()",
                                       &low_fee,"low_fee");
                            local_6a0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_698 = "";
                            local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_04.m_end = (iterator)pCVar41;
                            msg_04.m_begin = pvVar38;
                            file_04.m_end = (iterator)0xbb;
                            file_04.m_begin = (iterator)&local_6a0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_04,(size_t)&local_6b0,msg_04);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_6c0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6b8 = "";
                            pCVar41 = (CAmount *)(this_03.field2 + 0x70);
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_6c0,0xbb,1,2,pCVar41,
                                       "entry6_low_prioritised->GetFee()",&low_fee,"low_fee");
                            local_6d0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6c8 = "";
                            local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_05.m_end = (iterator)pCVar41;
                            msg_05.m_begin = pvVar38;
                            file_05.m_end = (iterator)0xbc;
                            file_05.m_begin = (iterator)&local_6d0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_05,(size_t)&local_6e0,msg_05);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_6f0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6e8 = "";
                            pvVar38 = (iterator)
                                      (oVar51.
                                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                       ._M_payload.field2 + 0x70);
                            pvVar39 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_6f0,0xbc,1,2,pvVar38,"entry7_high->GetFee()",
                                       pCVar55,"high_fee");
                            local_700 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6f8 = "";
                            local_710 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_708 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_06.m_end = pvVar38;
                            msg_06.m_begin = pvVar39;
                            file_06.m_end = (iterator)0xbd;
                            file_06.m_begin = (iterator)&local_700;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_06,(size_t)&local_710,msg_06);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_720 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_718 = "";
                            pvVar38 = (iterator)
                                      (oVar52.
                                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                       ._M_payload.field2 + 0x70);
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                                      (&tx1_1,&local_720,0xbd,1,2,pvVar38,"entry8_high->GetFee()",
                                       pCVar55,"high_fee");
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar45.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar10 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar45.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar14 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar46.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar18 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar46.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar22 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_25._M_len = 2;
                            __l_25._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_12_normal,__l_25,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar47.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar11 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar47.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar15 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar48.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar19 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar48.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar23 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_26._M_len = 2;
                            __l_26._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_34_cpfp,__l_26,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar49.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar12 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar49.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar16 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar50.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar20 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar50.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar24 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_27._M_len = 2;
                            __l_27._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_56_low,__l_27,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar51.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar13 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar51.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar17 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar52.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            cVar21 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_finish;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar52.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar25 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_28._M_len = 2;
                            __l_28._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_78_high,__l_28,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            pCVar40 = &tx2_1;
                            __l_29._M_len = 8;
                            __l_29._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar10;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar14;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar18;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar22;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = uVar11;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar15;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar19;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar23;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar12;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar16;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)this_03;
                            tx1_1._48_8_ = oVar51.
                                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                           ._M_payload;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_entries,__l_29,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)pCVar40);
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &empty_set._M_t._M_impl.super__Rb_tree_header._M_header;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
                            ;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                            GetRandHash();
                            local_730 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_728 = "";
                            local_740 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_738 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_07.m_end = pvVar38;
                            msg_07.m_begin = (iterator)pCVar40;
                            file_07.m_end = (iterator)0xcd;
                            file_07.m_begin = (iterator)&local_730;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_07,(size_t)&local_740,msg_07);
                            all_children._M_t._M_impl._0_8_ = *(CAmount *)(_Var30.field2 + 0xa8) + 1
                            ;
                            iVar27 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)_Var30);
                            CFeeRate::CFeeRate(&local_748,(CAmount *)&all_children,iVar27 + 2);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_748,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2c95e;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts( set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize() + 2), unused_txid).has_value()"
                                 + 0x8d;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_758 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_750 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_758,0xcd);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_768 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_760 = "";
                            local_778 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_770 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_08.m_end = pvVar39;
                            msg_08.m_begin = pvVar38;
                            file_08.m_end = (iterator)0xcf;
                            file_08.m_begin = (iterator)&local_768;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_08,(size_t)&local_778,msg_08);
                            all_children._M_t._M_impl._0_8_ = *(CAmount *)(_Var30.field2 + 0xa8);
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)_Var30);
                            CFeeRate::CFeeRate(&local_780,(CAmount *)&all_children,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_780,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2c977;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee(), entry1_normal->GetTxSize()), unused_txid).has_value()"
                                 + 0x84;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_790 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_788 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_790,0xcf);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_7a0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_798 = "";
                            local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_09.m_end = pvVar39;
                            msg_09.m_begin = pvVar38;
                            file_09.m_end = (iterator)0xd0;
                            file_09.m_begin = (iterator)&local_7a0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_09,(size_t)&local_7b0,msg_09);
                            all_children._M_t._M_impl._0_8_ = *(CAmount *)(_Var30.field2 + 0xa8) + 1
                            ;
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)_Var30);
                            CFeeRate::CFeeRate(&local_7b8,(CAmount *)&all_children,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_7b8,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2c990;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0x8c;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_7c8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7c0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_7c8,0xd0);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_7d8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7d0 = "";
                            local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_10.m_end = pvVar39;
                            msg_10.m_begin = pvVar38;
                            file_10.m_end = (iterator)0xd2;
                            file_10.m_begin = (iterator)&local_7d8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_10,(size_t)&local_7e8,msg_10);
                            __l_30._M_len = 1;
                            __l_30._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = this_02;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_30,(CompareIteratorByHash *)&witness,
                                  (allocator_type *)&local_418._M_value);
                            local_3d8.field2 = *(CAmount *)(this_02.field2 + 0xa8) + 1;
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)this_02);
                            CFeeRate::CFeeRate(&local_7f0,(CAmount *)&local_3d8,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_7f0,&unused_txid);
                            all_parents._M_t._M_impl._0_8_ =
                                 CONCAT71(all_parents._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^ 1
                            ;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_d2c9a9;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry5_low}, CFeeRate(entry5_low->GetModifiedFee() + 1, entry5_low->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0x85;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_800 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7f8 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,(check_type)pCVar55,(size_t)&local_800,0xd2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_810 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_808 = "";
                            local_820 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_818 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_11.m_end = pvVar39;
                            msg_11.m_begin = pvVar38;
                            file_11.m_end = (iterator)0xd3;
                            file_11.m_begin = (iterator)&local_810;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_11,(size_t)&local_820,msg_11);
                            __l_31._M_len = 1;
                            __l_31._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = this_03;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_31,(CompareIteratorByHash *)&witness,
                                  (allocator_type *)&local_418._M_value);
                            local_3d8.field2 = *(CAmount *)(this_03.field2 + 0x70) + 1;
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)this_03);
                            CFeeRate::CFeeRate(&local_828,(CAmount *)&local_3d8,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_828,&unused_txid);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_d2c9c2;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid).has_value()"
                                 + 0x9d;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_838 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_830 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,(check_type)pCVar55,(size_t)&local_838,0xd3);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_848 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_840 = "";
                            local_858 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_850 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_12.m_end = pvVar39;
                            msg_12.m_begin = pvVar38;
                            file_12.m_end = (iterator)0xd4;
                            file_12.m_begin = (iterator)&local_848;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_12,(size_t)&local_858,msg_12);
                            __l_32._M_len = 1;
                            __l_32._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = this_03;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_32,(CompareIteratorByHash *)&witness,
                                  (allocator_type *)&local_418._M_value);
                            local_3d8.field2 = *(CAmount *)(this_03.field2 + 0xa8) + 1;
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)this_03);
                            CFeeRate::CFeeRate(&local_860,(CAmount *)&local_3d8,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_860,&unused_txid);
                            all_parents._M_t._M_impl._0_8_ =
                                 CONCAT71(all_parents._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^ 1
                            ;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_d2c9db;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetModifiedFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0xa9;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_870 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_868 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,(check_type)pCVar55,(size_t)&local_870,0xd4);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_880 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_878 = "";
                            local_890 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_888 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_13.m_end = pvVar39;
                            msg_13.m_begin = pvVar38;
                            file_13.m_end = (iterator)0xd8;
                            file_13.m_begin = (iterator)&local_880;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_13,(size_t)&local_890,msg_13);
                            all_children._M_t._M_impl._0_8_ = *(CAmount *)(this_01.field2 + 0xa8);
                            uVar28 = CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)this_01);
                            CFeeRate::CFeeRate(&local_898,(CAmount *)&all_children,uVar28);
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_34_cpfp,local_898,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2c9f4;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_34_cpfp, CFeeRate(entry4_high->GetModifiedFee(), entry4_high->GetTxSize()), unused_txid).has_value()"
                                 + 0x7e;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_8a8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8a0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_8a8,0xd8);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_8b8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8b0 = "";
                            local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_14.m_end = pvVar39;
                            msg_14.m_begin = pvVar38;
                            file_14.m_end = (iterator)0xdb;
                            file_14.m_begin = (iterator)&local_8b8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_14,(size_t)&local_8c8,msg_14);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx1.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_33._M_len = 1;
                            __l_33._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_33,
                                  (less<transaction_identifier<false>_> *)&local_3d8._M_value,
                                  (allocator_type *)&witness);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&empty_set,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_8_ =
                                 CONCAT71(all_children._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^
                                 1;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_d2ca0d;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(empty_set, {tx1->GetHash()}, unused_txid) == std::nullopt"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_8d8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8d0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_8d8,0xdb);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_8e8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8e0 = "";
                            local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_15.m_end = pvVar39;
                            msg_15.m_begin = pvVar38;
                            file_15.m_end = (iterator)0xdc;
                            file_15.m_begin = (iterator)&local_8e8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_15,(size_t)&local_8f8,msg_15);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx3.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_34._M_len = 1;
                            __l_34._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_34,
                                  (less<transaction_identifier<false>_> *)&local_3d8._M_value,
                                  (allocator_type *)&witness);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_8_ =
                                 CONCAT71(all_children._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^
                                 1;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_d2ca26;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx3->GetHash()}, unused_txid) == std::nullopt"
                                 + 0x55;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_908 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_900 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_908,0xdc);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_918 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_910 = "";
                            local_928 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_920 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_16.m_end = pvVar39;
                            msg_16.m_begin = pvVar38;
                            file_16.m_end = (iterator)0xdd;
                            file_16.m_begin = (iterator)&local_918;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_16,(size_t)&local_928,msg_16);
                            __l_35._M_len = 1;
                            __l_35._M_array = (iterator)&witness;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var31;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_35,(CompareIteratorByHash *)&local_418._M_value,
                                  (allocator_type *)&local_438._M_value);
                            puVar8 = &((tx2.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped;
                            all_parents._M_t._M_impl._0_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[0];
                            all_parents._M_t._M_impl._1_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[1];
                            all_parents._M_t._M_impl._2_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[2];
                            all_parents._M_t._M_impl._3_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[3];
                            all_parents._M_t._M_impl._4_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[4];
                            all_parents._M_t._M_impl._5_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[5];
                            all_parents._M_t._M_impl._6_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[6];
                            all_parents._M_t._M_impl._7_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[7];
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 *(undefined8 *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 *(_Base_ptr *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 *(_Base_ptr *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_36._M_len = 1;
                            __l_36._M_array = (iterator)&all_parents;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&entry_1,__l_36,
                                  (less<transaction_identifier<false>_> *)&parent_inputs,
                                  (allocator_type *)local_468);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1,(setEntries *)&tx1_1,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&entry_1,&unused_txid);
                            all_conflicts._M_t._M_impl._0_1_ =
                                 tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._0_1_;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb8dd2;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb8e25;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_938 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_930 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&local_3d8;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_conflicts,
                                       (lazy_ostream *)&all_children,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_938,0xdd);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_948 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_940 = "";
                            local_958 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_950 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_17.m_end = pvVar39;
                            msg_17.m_begin = pvVar38;
                            file_17.m_end = (iterator)0xde;
                            file_17.m_begin = (iterator)&local_948;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_17,(size_t)&local_958,msg_17);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx1.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_37._M_len = 1;
                            __l_37._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_37,
                                  (less<transaction_identifier<false>_> *)&local_3d8._M_value,
                                  (allocator_type *)&witness);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_d2ca58;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx1->GetHash()}, unused_txid).has_value()"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_968 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_960 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_968,0xde);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_978 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_970 = "";
                            local_988 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_980 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_18.m_end = pvVar39;
                            msg_18.m_begin = pvVar38;
                            file_18.m_end = (iterator)0xdf;
                            file_18.m_begin = (iterator)&local_978;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_18,(size_t)&local_988,msg_18);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx2.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_38._M_len = 1;
                            __l_38._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_38,
                                  (less<transaction_identifier<false>_> *)&local_3d8._M_value,
                                  (allocator_type *)&witness);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_1_ = entry_1.spendsCoinbase;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_d2ca63;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx2->GetHash()}, unused_txid).has_value()"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_998 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_990 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_998,0xdf);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_9a8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9a0 = "";
                            local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_19.m_end = pvVar39;
                            msg_19.m_begin = pvVar38;
                            file_19.m_end = (iterator)0xe2;
                            file_19.m_begin = (iterator)&local_9a8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_19,(size_t)&local_9b8,msg_19);
                            __l_39._M_len = 1;
                            __l_39._M_array = (iterator)&witness;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var31;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_39,(CompareIteratorByHash *)&local_418._M_value,
                                  (allocator_type *)&local_438._M_value);
                            puVar8 = &((tx1.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->hash).m_wrapped;
                            all_parents._M_t._M_impl._0_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[0];
                            all_parents._M_t._M_impl._1_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[1];
                            all_parents._M_t._M_impl._2_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[2];
                            all_parents._M_t._M_impl._3_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[3];
                            all_parents._M_t._M_impl._4_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[4];
                            all_parents._M_t._M_impl._5_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[5];
                            all_parents._M_t._M_impl._6_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[6];
                            all_parents._M_t._M_impl._7_1_ =
                                 (puVar8->super_base_blob<256U>).m_data._M_elems[7];
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 *(undefined8 *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 *(_Base_ptr *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 *(_Base_ptr *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_40._M_len = 1;
                            __l_40._M_array = (iterator)&all_parents;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&entry_1,__l_40,
                                  (less<transaction_identifier<false>_> *)&parent_inputs,
                                  (allocator_type *)local_468);
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1,(setEntries *)&tx1_1,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&entry_1,&unused_txid);
                            all_conflicts._M_t._M_impl._0_8_ =
                                 CONCAT71(all_conflicts._M_t._M_impl._1_7_,
                                          tx2_1.vout.
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._0_1_) ^ 1;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb8eca;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb8f21;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&local_3d8;
                            local_9c8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9c0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_conflicts,
                                       (lazy_ostream *)&all_children,1,0,WARN,(check_type)pCVar55,
                                       (size_t)&local_9c8,0xe2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1);
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_9d8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9d0 = "";
                            local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_20.m_end = pvVar39;
                            msg_20.m_begin = pvVar38;
                            file_20.m_end = (iterator)0xed;
                            file_20.m_begin = (iterator)&local_9d8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_20,(size_t)&local_9e8,msg_20);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,1000000,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2ca9d;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF( high_fee, high_fee, 1, CFeeRate(0), unused_txid) == std::nullopt"
                                 + 0x4c;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_9f8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9f0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_9f8,0xed);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_a08 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a00 = "";
                            local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_21.m_end = pvVar39;
                            msg_21.m_begin = pvVar38;
                            file_21.m_end = (iterator)0xee;
                            file_21.m_begin = (iterator)&local_a08;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_21,(size_t)&local_a18,msg_21);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,999999,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cab6;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee - 1, 1, CFeeRate(0), unused_txid).has_value()"
                                 + 0x4b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a28 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a20 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_a28,0xee);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_a38 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a30 = "";
                            local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_22.m_end = pvVar39;
                            msg_22.m_begin = pvVar38;
                            file_22.m_end = (iterator)0xef;
                            file_22.m_begin = (iterator)&local_a38;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_22,(size_t)&local_a48,msg_22);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,0xf4241,1000000,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cacf;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee + 1, high_fee, 1, CFeeRate(0), unused_txid).has_value()"
                                 + 0x4b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a58 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a50 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_a58,0xef);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_a68 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a60 = "";
                            local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_23.m_end = pvVar39;
                            msg_23.m_begin = pvVar38;
                            file_23.m_end = (iterator)0xf1;
                            file_23.m_begin = (iterator)&local_a68;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_23,(size_t)&local_a78,msg_23);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4241,2,(CFeeRate)0x3e8,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cada;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 1, 2, incremental_relay_feerate, unused_txid).has_value()"
                                 + 0x59;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a88 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a80 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_a88,0xf1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_a98 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a90 = "";
                            local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_24.m_end = pvVar39;
                            msg_24.m_begin = pvVar38;
                            file_24.m_end = (iterator)0xf2;
                            file_24.m_begin = (iterator)&local_a98;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_24,(size_t)&local_aa8,msg_24);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4242,2,(CFeeRate)0x3e8,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2caf3;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 2, 2, incremental_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x5d;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_ab8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ab0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_ab8,0xf2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_ac8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ac0 = "";
                            local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_25.m_end = pvVar39;
                            msg_25.m_begin = pvVar38;
                            file_25.m_end = (iterator)0xf3;
                            file_25.m_begin = (iterator)&local_ac8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_25,(size_t)&local_ad8,msg_25);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4242,2,(CFeeRate)0x7d0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cb0c;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 2, 2, higher_relay_feerate, unused_txid).has_value()"
                                 + 0x54;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_ae8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ae0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_ae8,0xf3);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_af8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_af0 = "";
                            local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_26.m_end = pvVar39;
                            msg_26.m_begin = pvVar38;
                            file_26.m_end = (iterator)0xf4;
                            file_26.m_begin = (iterator)&local_af8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_26,(size_t)&local_b08,msg_26);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4244,2,(CFeeRate)0x7d0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cb25;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 4, 2, higher_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x58;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b18 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b10 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_b18,0xf4);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_b28 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b20 = "";
                            local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_27.m_end = pvVar39;
                            msg_27.m_begin = pvVar38;
                            file_27.m_end = (iterator)0xf5;
                            file_27.m_begin = (iterator)&local_b28;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_27,(size_t)&local_b38,msg_27);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,10000,1000000,99999999,(CFeeRate)0x3e8,&unused_txid
                                      );
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cb3e;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(low_fee, high_fee, 99999999, incremental_relay_feerate, unused_txid).has_value()"
                                 + 0x5b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b48 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b40 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_b48,0xf5);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_b58 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b50 = "";
                            local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_28.m_end = pvVar39;
                            msg_28.m_begin = pvVar38;
                            file_28.m_end = (iterator)0xf6;
                            file_28.m_begin = (iterator)&local_b58;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_28,(size_t)&local_b68,msg_28);
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,10000,100999999,99999999,(CFeeRate)0x3e8,
                                       &unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_d2cb57;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(low_fee, high_fee + 99999999, 99999999, incremental_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x6a;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b78 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b70 = "";
                            pvVar38 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_b78,0xf6);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            __l_41._M_len = 5;
                            __l_41._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar10;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar14;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar11;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar15;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = uVar12;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar16;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar13;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar17;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = cVar21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar25;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_parents,__l_41,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            pCVar40 = &tx2_1;
                            __l_42._M_len = 3;
                            __l_42._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar18;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar22;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar19;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar23;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = uVar20;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar24;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_children,__l_42,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)pCVar40);
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1,
                                         &((this->super_TestChain100Setup).m_coinbase_txns.
                                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &(this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[1].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1.vout.
                                             super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                             _M_impl.super__Vector_impl_data._M_finish,
                                         &(this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[2].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1.version,
                                         &(this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[3].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(local_1a0,
                                         &(this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[4].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            __l_43._M_len = 5;
                            __l_43._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector(&parent_inputs,__l_43,(allocator_type *)&entry_1);
                            lVar36 = 0x48;
                            do {
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         ((long)&tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar36))
                              ;
                              lVar36 = lVar36 + -0x10;
                            } while (lVar36 != -8);
                            entry_1.nFee = 50000000;
                            __l_44._M_len = 1;
                            __l_44._M_array = &entry_1.nFee;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx1_1,__l_44,
                                       (allocator_type *)&tx2_1);
                            make_tx((rbf_tests *)&conflicts_with_parents,&parent_inputs,
                                    (vector<long,_std::allocator<long>_> *)&tx1_1);
                            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                      ((_Vector_base<long,_std::allocator<long>_> *)&tx1_1);
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffff00000000;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                            local_bb0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ba8 = "";
                            local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_29.m_end = pvVar38;
                            msg_29.m_begin = (iterator)pCVar40;
                            file_29.m_end = (iterator)0x102;
                            file_29.m_begin = (iterator)&local_bb0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_29,(size_t)&local_bc0,msg_29);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb9234;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb929c;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_bd0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_bc8 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_bd0,0x102);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_be0 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_bd8 = "";
                            local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_30.m_end = pvVar39;
                            msg_30.m_begin = pvVar38;
                            file_30.m_end = (iterator)0x103;
                            file_30.m_begin = (iterator)&local_be0;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_30,(size_t)&local_bf0,msg_30);
                            bVar26 = std::operator==(&all_conflicts._M_t,&all_entries._M_t);
                            entry_1.nFee = CONCAT71(entry_1.nFee._1_7_,bVar26);
                            entry_1.time.__d.__r = (duration)0;
                            entry_1.nHeight = 0;
                            entry_1._20_4_ = 0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_d2cb89;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0xbb92b9;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x70;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x113a0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&tx2_1,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&tx2_1 >> 8);
                            local_c00 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_bf8 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&entry_1,(lazy_ostream *)&tx1_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_c00,0x103);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)&entry_1.nHeight);
                            conflicts_size =
                                 all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count;
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            add_descendants(local_c18,&tx2,0x17,this_00);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_c10);
                            local_c28 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c20 = "";
                            local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_c30 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_31.m_end = pvVar39;
                            msg_31.m_begin = pvVar38;
                            file_31.m_end = (iterator)0x108;
                            file_31.m_begin = (iterator)&local_c28;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_31,(size_t)&local_c38,msg_31);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb92ba;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb9321;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_c48 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c40 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar55,(size_t)&local_c48,0x108);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            conflicts_size = conflicts_size + 0x17;
                            local_c58 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c50 = "";
                            local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_32.m_end = pvVar39;
                            msg_32.m_begin = pvVar38;
                            file_32.m_end = (iterator)0x10a;
                            file_32.m_begin = (iterator)&local_c58;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_32,(size_t)&local_c68,msg_32);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_c78 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c70 = "";
                            pTVar42 = &entry_1;
                            entry_1.nFee = all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                            pvVar38 = (iterator)0x2;
                            psVar56 = &conflicts_size;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                                      (&tx1_1,&local_c78,0x10a,1,2,pTVar42,"all_conflicts.size()",
                                       &conflicts_size,"conflicts_size");
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            add_descendants(local_c88,&tx4,0x17,this_00);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_c80);
                            local_c98 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c90 = "";
                            local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_33.m_end = (iterator)pTVar42;
                            msg_33.m_begin = pvVar38;
                            file_33.m_end = (iterator)0x10e;
                            file_33.m_begin = (iterator)&local_c98;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_33,(size_t)&local_ca8,msg_33);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb92ba;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb9321;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_cb8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_cb0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)psVar56,(size_t)&local_cb8,0x10e);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            conflicts_size = conflicts_size + 0x17;
                            local_cc8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_cc0 = "";
                            local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_34.m_end = pvVar39;
                            msg_34.m_begin = pvVar38;
                            file_34.m_end = (iterator)0x110;
                            file_34.m_begin = (iterator)&local_cc8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_34,(size_t)&local_cd8,msg_34);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_ce8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ce0 = "";
                            pTVar42 = &entry_1;
                            entry_1.nFee = all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                            pvVar38 = (iterator)0x2;
                            psVar56 = &conflicts_size;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                                      (&tx1_1,&local_ce8,0x110,1,2,pTVar42,"all_conflicts.size()",
                                       &conflicts_size,"conflicts_size");
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            add_descendants(local_cf8,&tx6,0x17,this_00);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_cf0);
                            local_d08 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d00 = "";
                            local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_35.m_end = (iterator)pTVar42;
                            msg_35.m_begin = pvVar38;
                            file_35.m_end = (iterator)0x114;
                            file_35.m_begin = (iterator)&local_d08;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_35,(size_t)&local_d18,msg_35);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb92ba;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb9321;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_d28 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d20 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)psVar56,(size_t)&local_d28,0x114);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            conflicts_size = conflicts_size + 0x17;
                            local_d38 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d30 = "";
                            local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_36.m_end = pvVar39;
                            msg_36.m_begin = pvVar38;
                            file_36.m_end = (iterator)0x116;
                            file_36.m_begin = (iterator)&local_d38;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_36,(size_t)&local_d48,msg_36);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_d58 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d50 = "";
                            pTVar42 = &entry_1;
                            entry_1.nFee = all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                            pvVar38 = (iterator)0x2;
                            psVar56 = &conflicts_size;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                                      (&tx1_1,&local_d58,0x116,1,2,pTVar42,"all_conflicts.size()",
                                       &conflicts_size,"conflicts_size");
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            add_descendants(local_d68,&tx7,0x17,this_00);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_d60);
                            local_d78 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d70 = "";
                            local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_37.m_end = (iterator)pTVar42;
                            msg_37.m_begin = pvVar38;
                            file_37.m_end = (iterator)0x11a;
                            file_37.m_begin = (iterator)&local_d78;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_37,(size_t)&local_d88,msg_37);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            pCVar40 = &tx2_1;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb92ba;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb9321;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_d98 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d90 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)pCVar40,(lazy_ostream *)&entry_1,1,0,WARN
                                       ,(check_type)psVar56,(size_t)&local_d98,0x11a);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            conflicts_size = conflicts_size + 0x17;
                            local_da8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_da0 = "";
                            local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_38.m_end = pvVar39;
                            msg_38.m_begin = pvVar38;
                            file_38.m_end = (iterator)0x11c;
                            file_38.m_begin = (iterator)&local_da8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_38,(size_t)&local_db8,msg_38);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_dc8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_dc0 = "";
                            pTVar42 = &entry_1;
                            entry_1.nFee = all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                                      (&tx1_1,&local_dc8,0x11c,1,2,pTVar42,"all_conflicts.size()",
                                       &conflicts_size,"conflicts_size");
                            local_dd8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_dd0 = "";
                            local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_de0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_39.m_end = (iterator)pTVar42;
                            msg_39.m_begin = pvVar38;
                            file_39.m_end = (iterator)0x11d;
                            file_39.m_begin = (iterator)&local_dd8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_39,(size_t)&local_de8,msg_39);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x30;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x1139f;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x40;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x114e1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0xe1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0xc694;
                            local_df8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_df0 = "";
                            pTVar42 = &entry_1;
                            entry_1.nFee = all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT44(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                   100);
                            pvVar38 = (iterator)0x2;
                            boost::test_tools::tt_detail::
                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                                      (&tx1_1,&local_df8,0x11d,1,2,pTVar42,"all_conflicts.size()",
                                       pCVar40,"100");
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            add_descendants(local_e08,&tx8,1,this_00);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      (&local_e00);
                            local_e18 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e10 = "";
                            local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_40.m_end = (iterator)pTVar42;
                            msg_40.m_begin = pvVar38;
                            file_40.m_end = (iterator)0x122;
                            file_40.m_begin = (iterator)&local_e18;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_40,(size_t)&local_e28,msg_40);
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb9346;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb93a9;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_e38 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e30 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar40,(size_t)&local_e38,0x122);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx2_1,
                                         &tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            __l_45._M_len = 1;
                            __l_45._M_array = (iterator)&tx2_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&tx1_1,__l_45,(allocator_type *)&witness);
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0x2255100;
                            __l_46._M_len = 1;
                            __l_46._M_array = (iterator)&local_3d8;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&entry_1,__l_46,
                                       (allocator_type *)&local_418._M_value);
                            make_tx((rbf_tests *)&spends_unconfirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
                            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                      ((_Vector_base<long,_std::allocator<long>_> *)&entry_1);
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&tx1_1);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_finish);
                            pCVar2 = ((spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->vin).
                                     super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                            for (pCVar37 = ((spends_unconfirmed.
                                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->vin).
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start; pCVar37 != pCVar2;
                                pCVar37 = pCVar37 + 1) {
                              local_e58 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_e50 = "";
                              local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
                              msg_41.m_end = pvVar39;
                              msg_41.m_begin = pvVar38;
                              file_41.m_end = (iterator)0x128;
                              file_41.m_begin = (iterator)&local_e58;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_41,(size_t)&local_e68,msg_41);
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start._0_1_ = 0;
                              uVar3 = *(undefined8 *)
                                       (pCVar37->prevout).hash.m_wrapped.super_base_blob<256U>.
                                       m_data._M_elems;
                              uVar4 = *(undefined8 *)
                                       ((pCVar37->prevout).hash.m_wrapped.super_base_blob<256U>.
                                        m_data._M_elems + 8);
                              uVar5 = *(undefined8 *)
                                       ((pCVar37->prevout).hash.m_wrapped.super_base_blob<256U>.
                                        m_data._M_elems + 0x10);
                              uVar6 = *(undefined8 *)
                                       ((pCVar37->prevout).hash.m_wrapped.super_base_blob<256U>.
                                        m_data._M_elems + 0x18);
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)uVar5;
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start._0_1_ =
                                   (undefined1)((ulong)uVar5 >> 0x38);
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start._1_7_ = (undefined7)uVar6;
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ =
                                   (char)((ulong)uVar6 >> 0x38);
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_ = (undefined7)uVar3;
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_1_ = (char)((ulong)uVar3 >> 0x38)
                              ;
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish._1_7_ = (undefined7)uVar4;
                              tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._0_1_ =
                                   (undefined1)((ulong)uVar4 >> 0x38);
                              bVar26 = CTxMemPool::exists(this_00,(GenTxid *)&tx1_1);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)CONCAT71(tx2_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  bVar26);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish = (pointer)0x0;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xbb93aa;
                              p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb93d8
                              ;
                              entry_1.time.__d.__r =
                                   (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                              entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                              entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                              entry_1.m_sequence = (uint64_t)&local_3d8;
                              local_e78 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_e70 = "";
                              pvVar38 = &DAT_00000001;
                              pvVar39 = (iterator)0x0;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,
                                         WARN,(check_type)pCVar40,(size_t)&local_e78,0x128);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)
                                         &tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage);
                            }
                            local_e88 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e80 = "";
                            local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_42.m_end = pvVar39;
                            msg_42.m_begin = pvVar38;
                            file_42.m_end = (iterator)0x12c;
                            file_42.m_begin = (iterator)&local_e88;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_42,(size_t)&local_e98,msg_42);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_entries);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb93d9;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb942b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            local_ea8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ea0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar40,(size_t)&local_ea8,300);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            local_eb8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_eb0 = "";
                            local_ec8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ec0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_43.m_end = pvVar39;
                            msg_43.m_begin = pvVar38;
                            file_43.m_end = (iterator)0x12d;
                            file_43.m_begin = (iterator)&local_eb8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_43,(size_t)&local_ec8,msg_43);
                            peVar9 = spends_unconfirmed.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            __l_47._M_len = 1;
                            __l_47._M_array = (iterator)&local_418;
                            local_418 = _Var31;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_47,(CompareIteratorByHash *)&local_438._M_value,
                                  (allocator_type *)local_468);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,peVar9,this_00,(setEntries *)&tx1_1);
                            local_3d8.field2 = CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            CStack_3c8.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_d2cc2f;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbb9481;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&witness;
                            local_ed8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ed0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&local_3d8._M_value,
                                       (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                       (size_t)&local_ed8,0x12d);
                            boost::detail::shared_count::~shared_count((shared_count *)&CStack_3c8);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_ee8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ee0 = "";
                            local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_44.m_end = pvVar39;
                            msg_44.m_begin = pvVar38;
                            file_44.m_end = (iterator)0x12e;
                            file_44.m_begin = (iterator)&local_ee8;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_44,(size_t)&local_ef8,msg_44);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&empty_set);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb9482;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb94cd;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_f08 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f00 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar40,(size_t)&local_f08,0x12e);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1,
                                         &tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &tx8.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            __l_48._M_len = 2;
                            __l_48._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&entry_1,__l_48,(allocator_type *)&witness);
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0x2255100;
                            __l_49._M_len = 1;
                            __l_49._M_array = (iterator)&local_3d8;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx2_1,__l_49,
                                       (allocator_type *)&local_418._M_value);
                            make_tx((rbf_tests *)&spends_new_unconfirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&entry_1,(vector<long,_std::allocator<long>_> *)&tx2_1);
                            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                      ((_Vector_base<long,_std::allocator<long>_> *)&tx2_1);
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&entry_1);
                            lVar36 = 0x18;
                            do {
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         ((long)&tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar36))
                              ;
                              lVar36 = lVar36 + -0x10;
                            } while (lVar36 != -8);
                            local_f28 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f20 = "";
                            local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_f30 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_45.m_end = pvVar39;
                            msg_45.m_begin = pvVar38;
                            file_45.m_end = (iterator)0x131;
                            file_45.m_begin = (iterator)&local_f28;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_45,(size_t)&local_f38,msg_45);
                            peVar9 = spends_new_unconfirmed.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            __l_50._M_len = 1;
                            __l_50._M_array = (iterator)&local_418;
                            local_418 = _Var31;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_50,(CompareIteratorByHash *)&local_438._M_value,
                                  (allocator_type *)local_468);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,peVar9,this_00,(setEntries *)&tx1_1);
                            local_3d8._0_1_ = entry_1.spendsCoinbase;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            CStack_3c8.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_d2cc47;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbb9523;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_f48 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f40 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&local_3d8._M_value,
                                       (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                       (size_t)&local_f48,0x131);
                            boost::detail::shared_count::~shared_count((shared_count *)&CStack_3c8);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_f58 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f50 = "";
                            local_f68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_46.m_end = pvVar39;
                            msg_46.m_begin = pvVar38;
                            file_46.m_end = (iterator)0x132;
                            file_46.m_begin = (iterator)&local_f58;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_46,(size_t)&local_f68,msg_46);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_new_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,&all_entries);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb9524;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbb9575;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_0113a070;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_f78 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f70 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&local_3d8;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       (check_type)pCVar40,(size_t)&local_f78,0x132);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1);
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1,
                                         &((this->super_TestChain100Setup).m_coinbase_txns.
                                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)&tx1_1.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &(this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[1].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        );
                            __l_51._M_len = 2;
                            __l_51._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&entry_1,__l_51,(allocator_type *)&witness);
                            local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0x2aea540;
                            __l_52._M_len = 1;
                            __l_52._M_array = (iterator)&local_3d8;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx2_1,__l_52,
                                       (allocator_type *)&local_418._M_value);
                            make_tx((rbf_tests *)&spends_conflicting_confirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&entry_1,(vector<long,_std::allocator<long>_> *)&tx2_1);
                            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                      ((_Vector_base<long,_std::allocator<long>_> *)&tx2_1);
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&entry_1);
                            lVar36 = 0x18;
                            do {
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         ((long)&tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar36))
                              ;
                              lVar36 = lVar36 + -0x10;
                            } while (lVar36 != -8);
                            local_f98 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f90 = "";
                            local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_47.m_end = pvVar39;
                            msg_47.m_begin = pvVar38;
                            file_47.m_end = (iterator)0x135;
                            file_47.m_begin = (iterator)&local_f98;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_47,(size_t)&local_fa8,msg_47);
                            __l_53._M_len = 2;
                            __l_53._M_array = (iterator)&witness;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var30;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 (pointer)oVar47.
                                          super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                          ._M_payload;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_53,(CompareIteratorByHash *)&local_438._M_value,
                                  (allocator_type *)local_468);
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,
                                       spends_conflicting_confirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_00,(setEntries *)&tx1_1);
                            local_3d8.field2 = CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                            p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            CStack_3c8.
                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)0x0;
                            local_418 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb9576;
                            local_410 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xbb95e1;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_fb8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_fb0 = "";
                            pvVar38 = &DAT_00000001;
                            pvVar39 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&local_418;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&local_3d8._M_value,
                                       (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                       (size_t)&local_fb8,0x135);
                            boost::detail::shared_count::~shared_count((shared_count *)&CStack_3c8);
                            std::
                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_fd8._16_8_ =
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_fd8._24_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x62;
                            pbVar35 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_fd8;
                            local_fd8._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            local_fd8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            msg_48.m_end = pvVar39;
                            msg_48.m_begin = pvVar38;
                            file_48.m_end = (iterator)0x13a;
                            file_48.m_begin = local_fd8 + 0x10;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_48,(size_t)pbVar35,msg_48);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_01139f30;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (long)"\x05\x04\x03\x02\x01" + 5;
                            local_fe8 = 
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_fe0 = "";
                            CTxMemPool::CheckConflictTopology_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,this_00,&set_34_cpfp);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\0') {
                              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                std::__throw_bad_optional_access();
                              }
                            }
                            else {
                              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            *)&witness,
                                           (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            *)this_01);
                              base_blob<256u>::ToString_abi_cxx11_
                                        ((string *)&local_3d8._M_value,
                                         (base_blob<256u> *)
                                         ((long)&witness.stack.
                                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[2].
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 1));
                              pCVar40 = &tx2_1;
                              tinyformat::format<std::__cxx11::string>
                                        ((string *)pCVar40,
                                         (tinyformat *)"%s has 23 descendants, max 1 allowed",
                                         (char *)&local_3d8,pbVar35);
                              pvVar38 = (iterator)0x2;
                              pCVar43 = &tx1_1;
                              boost::test_tools::tt_detail::
                              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                        (&entry_1,&local_fe8,0x13a,1,2,pCVar43,
                                         "pool.CheckConflictTopology(set_34_cpfp).value()",pCVar40,
                                         "tfm::format(\"%s has 23 descendants, max 1 allowed\", entry4_high->GetSharedTx()->GetHash().ToString())"
                                        );
                              std::__cxx11::string::~string((string *)&tx2_1);
                              std::__cxx11::string::~string((string *)&local_3d8._M_value);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         &witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&tx1_1);
                              local_ff8 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_ff0 = "";
                              local_1008 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
                              msg_49.m_end = (iterator)pCVar43;
                              msg_49.m_begin = pvVar38;
                              file_49.m_end = (iterator)0x13d;
                              file_49.m_begin = (iterator)&local_ff8;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_49,(size_t)&local_1008,msg_49);
                              __l_54._M_len = 1;
                              __l_54._M_array = (iterator)&local_418;
                              local_418 = _Var32;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_54,(CompareIteratorByHash *)&local_438._M_value,
                                    (allocator_type *)local_468);
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_00,(setEntries *)&tx1_1);
                              local_3d8.field2 =
                                   CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                              p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              CStack_3c8.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (element_type *)0x0;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)anon_var_dwarf_d2ccc7;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbb96db;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_0113a070;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_1018 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_1010 = "";
                              pvVar38 = &DAT_00000001;
                              pvVar39 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&witness;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&local_3d8._M_value,
                                         (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                         (size_t)&local_1018,0x13d);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)&CStack_3c8);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1);
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              add_descendants(local_1028,&tx9,1,this_00);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_1020);
                              local_1038 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_1030 = "";
                              local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_1040 = &boost::unit_test::basic_cstring<char_const>::null;
                              msg_50.m_end = pvVar39;
                              msg_50.m_begin = pvVar38;
                              file_50.m_end = (iterator)0x141;
                              file_50.m_begin = (iterator)&local_1038;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_50,(size_t)&local_1048,msg_50);
                              __l_55._M_len = 1;
                              __l_55._M_array = (iterator)&local_418;
                              local_418 = _Var32;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_55,(CompareIteratorByHash *)&local_438._M_value,
                                    (allocator_type *)local_468);
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_00,(setEntries *)&tx1_1);
                              local_3d8.field2 =
                                   CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                              p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              CStack_3c8.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (element_type *)0x0;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)anon_var_dwarf_d2ccc7;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbb96db;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_0113a070;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_1058 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_1050 = "";
                              pvVar38 = &DAT_00000001;
                              pvVar39 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&witness;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&local_3d8._M_value,
                                         (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                         (size_t)&local_1058,0x141);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)&CStack_3c8);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1);
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              local_1068 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_1060 = "";
                              local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
                              msg_51.m_end = pvVar39;
                              msg_51.m_begin = pvVar38;
                              file_51.m_end = (iterator)0x144;
                              file_51.m_begin = (iterator)&local_1068;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_51,(size_t)&local_1078,msg_51);
                              __l_56._M_len = 3;
                              __l_56._M_array = (iterator)&witness;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var32;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var33;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var34;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_56,(CompareIteratorByHash *)&local_438._M_value,
                                    (allocator_type *)local_468);
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_00,(setEntries *)&tx1_1);
                              local_3d8.field2 =
                                   CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                              p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              CStack_3c8.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (element_type *)0x0;
                              local_418 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xbb96dc;
                              local_410 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xbb9740;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_0113a070;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_1088 = 
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_1080 = "";
                              pvVar38 = &DAT_00000001;
                              pvVar39 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&local_418;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&local_3d8._M_value,
                                         (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                         (size_t)&local_1088,0x144);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)&CStack_3c8);
                              std::
                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1);
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              add_descendants((rbf_tests *)&child_tx,&tx10,1,this_00);
                              oVar45 = CTxMemPool::GetIter(this_00,&((child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                              if (((undefined1  [16])
                                   oVar45.
                                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                  std::__throw_bad_optional_access();
                                }
                              }
                              else {
                                local_10a8 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_10a0 = "";
                                local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
                                msg_52.m_end = pvVar39;
                                msg_52.m_begin = pvVar38;
                                file_52.m_end = (iterator)0x149;
                                file_52.m_begin = (iterator)&local_10a8;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_52,(size_t)&local_10b8,msg_52);
                                __l_57._M_len = 3;
                                __l_57._M_array = (iterator)&witness;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var32;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var33;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var34
                                ;
                                std::
                                set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                       *)&tx1_1,__l_57,(CompareIteratorByHash *)&local_438._M_value,
                                      (allocator_type *)local_468);
                                CTxMemPool::CheckConflictTopology_abi_cxx11_
                                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1,this_00,(setEntries *)&tx1_1);
                                local_3d8.field2 =
                                     CONCAT71(local_3d8._1_7_,entry_1.spendsCoinbase) ^ 1;
                                p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                CStack_3c8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (element_type *)0x0;
                                local_418 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )0xbb96dc;
                                local_410.field2 = "";
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish =
                                     (pointer)((ulong)tx2_1.vin.
                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                              0xffffffffffffff00);
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start =
                                     (pointer)&PTR__lazy_ostream_0113a070;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage =
                                     (pointer)boost::unit_test::lazy_ostream::inst;
                                local_10c8 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_10c0 = "";
                                pvVar38 = &DAT_00000001;
                                pvVar39 = (iterator)0x0;
                                tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)&local_418;
                                boost::test_tools::tt_detail::report_assertion
                                          ((assertion_result *)&local_3d8._M_value,
                                           (lazy_ostream *)&tx2_1,1,0,WARN,(check_type)pCVar40,
                                           (size_t)&local_10c8,0x149);
                                boost::detail::shared_count::~shared_count
                                          ((shared_count *)&CStack_3c8);
                                std::
                                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1);
                                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1)
                                ;
                                local_10d8 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_10d0 = "";
                                local_10e8 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_10e0 = &boost::unit_test::basic_cstring<char_const>::null;
                                msg_53.m_end = pvVar39;
                                msg_53.m_begin = pvVar38;
                                file_53.m_end = (iterator)0x14a;
                                file_53.m_begin = (iterator)&local_10d8;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_53,(size_t)&local_10e8,msg_53);
                                __l_58._M_len = 4;
                                __l_58._M_array = (iterator)&tx2_1;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start = (pointer)_Var32;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish = (pointer)_Var33;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage = (pointer)_Var34;
                                tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)oVar45.
                                              super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                              ._M_payload.
                                              super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                              ._M_payload;
                                std::
                                set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                       *)&tx1_1,__l_58,(CompareIteratorByHash *)&local_438._M_value,
                                      (allocator_type *)local_468);
                                CTxMemPool::CheckConflictTopology_abi_cxx11_
                                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1,this_00,(setEntries *)&tx1_1);
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)(CONCAT71(witness.stack.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_418 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )0xbb9741;
                                local_410 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )0xbb97b4;
                                p_Stack_3d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                              ((ulong)p_Stack_3d0 & 0xffffffffffffff00);
                                local_3d8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )&PTR__lazy_ostream_0113a070;
                                CStack_3c8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (element_type *)boost::unit_test::lazy_ostream::inst;
                                local_10f8 = 
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_10f0 = "";
                                pvVar38 = &DAT_00000001;
                                pvVar39 = (iterator)0x0;
                                CStack_3c8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_418;
                                boost::test_tools::tt_detail::report_assertion
                                          ((assertion_result *)&witness,
                                           (lazy_ostream *)&local_3d8._M_value,1,0,WARN,
                                           (check_type)pCVar40,(size_t)&local_10f8,0x14a);
                                boost::detail::shared_count::~shared_count
                                          ((shared_count *)
                                           &witness.stack.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                std::
                                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1);
                                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1)
                                ;
                                add_descendants((rbf_tests *)&grand_child_tx,&child_tx,1,this_00);
                                oVar45 = CTxMemPool::GetIter(this_00,&((grand_child_tx.
                                                                                                                                                
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                                if (((undefined1  [16])
                                     oVar45.
                                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                    & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                    std::__throw_bad_optional_access();
                                  }
                                }
                                else {
                                  local_1118 = 
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                  ;
                                  local_1110 = "";
                                  local_1128 = &boost::unit_test::basic_cstring<char_const>::null;
                                  local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
                                  msg_54.m_end = pvVar39;
                                  msg_54.m_begin = pvVar38;
                                  file_54.m_end = (iterator)0x14f;
                                  file_54.m_begin = (iterator)&local_1118;
                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                             file_54,(size_t)&local_1128,msg_54);
                                  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       (pointer)((ulong)tx2_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                0xffffffffffffff00);
                                  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start =
                                       (pointer)&PTR__lazy_ostream_01139f30;
                                  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                                       (pointer)boost::unit_test::lazy_ostream::inst;
                                  tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0xc694e1;
                                  local_1138 = 
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                  ;
                                  local_1130 = "";
                                  pbVar35 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_468;
                                  __l_59._M_len = 3;
                                  __l_59._M_array = (iterator)&local_418;
                                  local_418 = _Var32;
                                  local_410 = _Var33;
                                  local_408 = _Var34;
                                  std::
                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                  ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                         *)&tx1_1,__l_59,(CompareIteratorByHash *)pbVar35,
                                        (allocator_type *)&local_c8._M_value);
                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&entry_1,this_00,(setEntries *)&tx1_1);
                                  if (entry_1.spendsCoinbase == false) {
                                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                      std::__throw_bad_optional_access();
                                    }
                                  }
                                  else {
                                    std::
                                    __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                                    __shared_ptr((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_438._M_value,
                                                 (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)_Var33);
                                    base_blob<256u>::ToString_abi_cxx11_
                                              ((string *)&witness,
                                               (base_blob<256u> *)(local_438.field2 + 0x39));
                                    tinyformat::format<std::__cxx11::string>
                                              ((string *)&local_3d8._M_value,
                                               (tinyformat *)"%s has 2 descendants, max 1 allowed",
                                               (char *)&witness,pbVar35);
                                    pvVar38 = (iterator)0x2;
                                    pTVar42 = &entry_1;
                                    boost::test_tools::tt_detail::
                                    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                              (&tx2_1,&local_1138,0x14f,1,2,pTVar42,
                                               "pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}).value()"
                                               ,&local_3d8,
                                               "tfm::format(\"%s has 2 descendants, max 1 allowed\", entry10_unchained->GetSharedTx()->GetHash().ToString())"
                                              );
                                    std::__cxx11::string::~string((string *)&local_3d8._M_value);
                                    std::__cxx11::string::~string((string *)&witness);
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                              (a_Stack_430);
                                    std::
                                    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&entry_1);
                                    std::_Rb_tree<$270907ca$>::~_Rb_tree
                                              ((_Rb_tree<_270907ca_> *)&tx1_1);
                                    local_1148 = 
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                    ;
                                    local_1140 = "";
                                    local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
                                    local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
                                    msg_55.m_end = (iterator)pTVar42;
                                    msg_55.m_begin = pvVar38;
                                    file_55.m_end = (iterator)0x151;
                                    file_55.m_begin = (iterator)&local_1148;
                                    boost::unit_test::unit_test_log_t::set_checkpoint
                                              (boost::unit_test::(anonymous_namespace)::
                                               unit_test_log,file_55,(size_t)&local_1158,msg_55);
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_finish =
                                         (pointer)((ulong)tx2_1.vin.
                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_start =
                                         (pointer)&PTR__lazy_ostream_01139f30;
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)boost::unit_test::lazy_ostream::inst;
                                    tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_start = (pointer)0xc694e1;
                                    local_1168 = 
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                    ;
                                    local_1160 = "";
                                    pbVar35 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_468;
                                    __l_60._M_len = 3;
                                    __l_60._M_array = (iterator)&local_418;
                                    local_418 = _Var32;
                                    local_410 = oVar45.
                                                super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                ._M_payload.
                                                super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                ._M_payload;
                                    local_408 = _Var34;
                                    std::
                                    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                    ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                           *)&tx1_1,__l_60,(CompareIteratorByHash *)pbVar35,
                                          (allocator_type *)&local_c8._M_value);
                                    CTxMemPool::CheckConflictTopology_abi_cxx11_
                                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&entry_1,this_00,(setEntries *)&tx1_1);
                                    if (entry_1.spendsCoinbase == false) {
                                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                        std::__throw_bad_optional_access();
                                      }
                                    }
                                    else {
                                      std::
                                      __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_438._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar45.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                      base_blob<256u>::ToString_abi_cxx11_
                                                ((string *)&witness,
                                                 (base_blob<256u> *)(local_438.field2 + 0x39));
                                      tinyformat::format<std::__cxx11::string>
                                                ((string *)&local_3d8._M_value,
                                                 (tinyformat *)"%s has 2 ancestors, max 1 allowed",
                                                 (char *)&witness,pbVar35);
                                      pvVar38 = (iterator)0x2;
                                      pTVar42 = &entry_1;
                                      boost::test_tools::tt_detail::
                                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                (&tx2_1,&local_1168,0x151,1,2,pTVar42,
                                                 "pool.CheckConflictTopology({entry9_unchained, entry10_grand_child, entry11_unchained}).value()"
                                                 ,&local_3d8,
                                                 "tfm::format(\"%s has 2 ancestors, max 1 allowed\", entry10_grand_child->GetSharedTx()->GetHash().ToString())"
                                                );
                                      std::__cxx11::string::~string((string *)&local_3d8._M_value);
                                      std::__cxx11::string::~string((string *)&witness);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(a_Stack_430);
                                      std::
                                      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                      std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                ((_Rb_tree<_270907ca_> *)&tx1_1);
                                      std::
                                      __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tx2_1,&tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                      std::
                                      __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&tx2_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                                  &tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                      __l_61._M_len = 2;
                                      __l_61._M_array = (iterator)&tx2_1;
                                      std::
                                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                *)&local_3d8._M_value,__l_61,
                                               (allocator_type *)&local_438._M_value);
                                      entry_1.nFee = 0;
                                      entry_1.time.__d.__r = (duration)0;
                                      entry_1.nHeight = 1;
                                      entry_1.m_sequence = 0;
                                      entry_1.spendsCoinbase = false;
                                      entry_1.sigOpCost = 4;
                                      entry_1.lp.height = 0;
                                      entry_1.lp.time = 0;
                                      entry_1.lp.maxInputBlock = (CBlockIndex *)0x0;
                                      witness.stack.
                                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2faf080
                                      ;
                                      __l_62._M_len = 1;
                                      __l_62._M_array = (iterator)&witness;
                                      std::vector<long,_std::allocator<long>_>::vector
                                                ((vector<long,_std::allocator<long>_> *)&tx1_1,
                                                 __l_62,(allocator_type *)&local_418._M_value);
                                      make_tx((rbf_tests *)&two_parent_child_tx,
                                              (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                               *)&local_3d8._M_value,
                                              (vector<long,_std::allocator<long>_> *)&tx1_1);
                                      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                                                ((_Vector_base<long,_std::allocator<long>_> *)&tx1_1
                                                );
                                      TestMemPoolEntryHelper::FromTx
                                                ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                 &two_parent_child_tx);
                                      CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&tx1_1);
                                      CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&tx1_1);
                                      std::
                                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                 *)&local_3d8._M_value);
                                      lVar36 = 0x18;
                                      do {
                                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                        ~__shared_count((__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                         *)((long)&tx2_1.vin.
                                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar36)
                                                  );
                                        lVar36 = lVar36 + -0x10;
                                      } while (lVar36 != -8);
                                      oVar45 = CTxMemPool::GetIter(this_00,&((two_parent_child_tx.
                                                                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                                      _Var30 = oVar45.
                                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                               ._M_payload;
                                      if (((undefined1  [16])
                                           oVar45.
                                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                          std::__throw_bad_optional_access();
                                        }
                                      }
                                      else {
                                        local_1188 = 
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                        ;
                                        local_1180 = "";
                                        local_1198 = &boost::unit_test::basic_cstring<char_const>::
                                                      null;
                                        local_1190 = &boost::unit_test::basic_cstring<char_const>::
                                                      null;
                                        msg_56.m_end = (iterator)pTVar42;
                                        msg_56.m_begin = pvVar38;
                                        file_56.m_end = (iterator)0x156;
                                        file_56.m_begin = (iterator)&local_1188;
                                        boost::unit_test::unit_test_log_t::set_checkpoint
                                                  (boost::unit_test::(anonymous_namespace)::
                                                   unit_test_log,file_56,(size_t)&local_1198,msg_56)
                                        ;
                                        tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_finish =
                                             (pointer)((ulong)tx2_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                        tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_start =
                                             (pointer)&PTR__lazy_ostream_01139f30;
                                        tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)boost::unit_test::lazy_ostream::inst;
                                        tx2_1.vout.
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start = (pointer)0xc694e1;
                                        local_11a8 = 
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                        ;
                                        local_11a0 = "";
                                        pbVar35 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_469;
                                        __l_63._M_len = 1;
                                        __l_63._M_array = (iterator)&local_c8;
                                        local_c8 = _Var34;
                                        std::
                                        set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                        ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                               *)&tx1_1,__l_63,
                                              (CompareIteratorByHash *)&local_d0._M_value,
                                              (allocator_type *)pbVar35);
                                        CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                  ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_00,(setEntries *)&tx1_1);
                                        if (entry_1.spendsCoinbase == false) {
                                          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                            std::__throw_bad_optional_access();
                                          }
                                        }
                                        else {
                                          std::
                                          __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_438._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)_Var34);
                                          base_blob<256u>::ToString_abi_cxx11_
                                                    ((string *)&witness,
                                                     (base_blob<256u> *)(local_438.field2 + 0x39));
                                          std::
                                          __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_468,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)_Var30);
                                          base_blob<256u>::ToString_abi_cxx11_
                                                    ((string *)&local_418._M_value,
                                                     (base_blob<256u> *)(local_468._0_8_ + 0x39));
                                          tinyformat::
                                          format<std::__cxx11::string,std::__cxx11::string>
                                                    ((string *)&local_3d8._M_value,
                                                     (tinyformat *)
                                                     "%s is not the only parent of child %s",
                                                     (char *)&witness,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_418._M_value,pbVar35);
                                          pvVar38 = (iterator)0x2;
                                          pTVar42 = &entry_1;
                                          boost::test_tools::tt_detail::
                                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                    (&tx2_1,&local_11a8,0x156,1,2,pTVar42,
                                                                                                          
                                                  "pool.CheckConflictTopology({entry11_unchained}).value()"
                                                  ,&local_3d8,
                                                  "tfm::format(\"%s is not the only parent of child %s\", entry11_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  );
                                          std::__cxx11::string::~string
                                                    ((string *)&local_3d8._M_value);
                                          std::__cxx11::string::~string
                                                    ((string *)&local_418._M_value);
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_468 + 8));
                                          std::__cxx11::string::~string((string *)&witness);
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count(a_Stack_430);
                                          std::
                                          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::_M_reset((
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                          std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                    ((_Rb_tree<_270907ca_> *)&tx1_1);
                                          local_11b8 = 
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                          ;
                                          local_11b0 = "";
                                          local_11c8 = &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                          local_11c0 = &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                          msg_57.m_end = (iterator)pTVar42;
                                          msg_57.m_begin = pvVar38;
                                          file_57.m_end = (iterator)0x157;
                                          file_57.m_begin = (iterator)&local_11b8;
                                          boost::unit_test::unit_test_log_t::set_checkpoint
                                                    (boost::unit_test::(anonymous_namespace)::
                                                     unit_test_log,file_57,(size_t)&local_11c8,
                                                     msg_57);
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_finish =
                                               (pointer)((ulong)tx2_1.vin.
                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_start =
                                               (pointer)&PTR__lazy_ostream_01139f30;
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage =
                                               (pointer)boost::unit_test::lazy_ostream::inst;
                                          tx2_1.vout.
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_start =
                                               (pointer)0xc694e1;
                                          local_11d8 = 
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                          ;
                                          local_11d0 = "";
                                          pbVar35 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_469;
                                          __l_64._M_len = 1;
                                          __l_64._M_array = (iterator)&local_c8;
                                          local_c8 = oVar53.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload;
                                          std::
                                          set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                          ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                 *)&tx1_1,__l_64,
                                                (CompareIteratorByHash *)&local_d0._M_value,
                                                (allocator_type *)pbVar35);
                                          CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                    ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_00,(setEntries *)&tx1_1);
                                          if (entry_1.spendsCoinbase == false) {
                                            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                              std::__throw_bad_optional_access();
                                            }
                                          }
                                          else {
                                            std::
                                            __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_438._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar53.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                            base_blob<256u>::ToString_abi_cxx11_
                                                      ((string *)&witness,
                                                       (base_blob<256u> *)(local_438.field2 + 0x39))
                                            ;
                                            std::
                                            __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_468,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)_Var30);
                                            base_blob<256u>::ToString_abi_cxx11_
                                                      ((string *)&local_418._M_value,
                                                       (base_blob<256u> *)(local_468._0_8_ + 0x39));
                                            tinyformat::
                                            format<std::__cxx11::string,std::__cxx11::string>
                                                      ((string *)&local_3d8._M_value,
                                                       (tinyformat *)
                                                       "%s is not the only parent of child %s",
                                                       (char *)&witness,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_418._M_value,pbVar35);
                                            pvVar38 = (iterator)0x2;
                                            pTVar42 = &entry_1;
                                            boost::test_tools::tt_detail::
                                            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                      (&tx2_1,&local_11d8,0x157,1,2,pTVar42,
                                                                                                              
                                                  "pool.CheckConflictTopology({entry12_unchained}).value()"
                                                  ,&local_3d8,
                                                  "tfm::format(\"%s is not the only parent of child %s\", entry12_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  );
                                            std::__cxx11::string::~string
                                                      ((string *)&local_3d8._M_value);
                                            std::__cxx11::string::~string
                                                      ((string *)&local_418._M_value);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_468 + 8));
                                            std::__cxx11::string::~string((string *)&witness);
                                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                            ~__shared_count(a_Stack_430);
                                            std::
                                            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::_M_reset((
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                            std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                      ((_Rb_tree<_270907ca_> *)&tx1_1);
                                            local_11e8 = 
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                            ;
                                            local_11e0 = "";
                                            local_11f8 = &boost::unit_test::
                                                          basic_cstring<char_const>::null;
                                            local_11f0 = &boost::unit_test::
                                                          basic_cstring<char_const>::null;
                                            msg_58.m_end = (iterator)pTVar42;
                                            msg_58.m_begin = pvVar38;
                                            file_58.m_end = (iterator)0x158;
                                            file_58.m_begin = (iterator)&local_11e8;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,file_58,(size_t)&local_11f8,
                                                       msg_58);
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)((ulong)tx2_1.vin.
                                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)&PTR__lazy_ostream_01139f30;
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)boost::unit_test::lazy_ostream::inst;
                                            tx2_1.vout.
                                            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                            _M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)0xc694e1;
                                            local_1208 = 
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                            ;
                                            local_1200 = "";
                                            pbVar35 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_468;
                                            __l_65._M_len = 1;
                                            __l_65._M_array = (iterator)&local_438;
                                            local_438 = _Var30;
                                            std::
                                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                            ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_65,(CompareIteratorByHash *)pbVar35,
                                                  (allocator_type *)&local_c8._M_value);
                                            CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                      ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_00,(setEntries *)&tx1_1);
                                            if (entry_1.spendsCoinbase == false) {
                                              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                std::__throw_bad_optional_access();
                                              }
                                            }
                                            else {
                                              std::
                                              __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_418._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)_Var30);
                                              base_blob<256u>::ToString_abi_cxx11_
                                                        ((string *)&witness,
                                                         (base_blob<256u> *)
                                                         (local_418.field2 + 0x39));
                                              tinyformat::format<std::__cxx11::string>
                                                        ((string *)&local_3d8._M_value,
                                                         (tinyformat *)
                                                         "%s has 2 ancestors, max 1 allowed",
                                                         (char *)&witness,pbVar35);
                                              lVar36 = 8;
                                              pvVar38 = (iterator)0x2;
                                              pTVar42 = &entry_1;
                                              boost::test_tools::tt_detail::
                                              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                        (&tx2_1,&local_1208,0x158,1,2,pTVar42,
                                                                                                                  
                                                  "pool.CheckConflictTopology({entry_two_parent_child}).value()"
                                                  ,&local_3d8,
                                                  "tfm::format(\"%s has 2 ancestors, max 1 allowed\", entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  );
                                              std::__cxx11::string::~string
                                                        ((string *)&local_3d8._M_value);
                                              std::__cxx11::string::~string((string *)&witness);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_410._M_value);
                                              std::
                                              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::_M_reset((
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                              std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                        ((_Rb_tree<_270907ca_> *)&tx1_1);
                                              std::
                                              __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ::__shared_ptr(&local_1218,
                                                             &tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                              entry_1.nFee = 0;
                                              entry_1.time.__d.__r = (duration)0;
                                              entry_1.nHeight = 1;
                                              entry_1.m_sequence = 0;
                                              entry_1.spendsCoinbase = false;
                                              entry_1.sigOpCost = 4;
                                              entry_1.lp.height = 0;
                                              entry_1.lp.time = 0;
                                              entry_1.lp.maxInputBlock = (CBlockIndex *)0x0;
                                              std::
                                              __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_c8._M_value,&local_1218);
                                              local_d0 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x2faf080;
                                              __l_66._M_len = 1;
                                              __l_66._M_array = (iterator)&local_d0;
                                              std::vector<long,_std::allocator<long>_>::vector
                                                        ((vector<long,_std::allocator<long>_> *)
                                                         &local_418._M_value,__l_66,
                                                         (allocator_type *)&local_469);
                                              if ((ulong)(((long)((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)(local_c8.field2 + 0x20))->_M_ptr -
                                                  (long)((__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                          *)(local_c8.field2 + 0x18))->_M_pi) / 0x28
                                                  ) < 2) {
                                                __assert_fail("parent->vout.size() >= 2",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ,0x2d,
                                                  "std::pair<CTransactionRef, CTransactionRef> rbf_tests::make_two_siblings(const CTransactionRef, const std::vector<CAmount> &)"
                                                  );
                                              }
                                              CMutableTransaction::CMutableTransaction(&tx1_1);
                                              std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                                                        (&tx1_1.vin,1);
                                              std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
                                                        (&tx1_1.vout,
                                                         local_410.field2 - (long)local_418 >> 3);
                                              puVar7 = (undefined8 *)
                                                       CONCAT71(tx1_1.vin.
                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_1_);
                                              uVar3 = *(undefined8 *)(local_c8.field2 + 0x39);
                                              uVar4 = *(undefined8 *)(local_c8.field2 + 0x41);
                                              uVar5 = *(undefined8 *)(local_c8.field2 + 0x51);
                                              puVar7[2] = *(undefined8 *)(local_c8.field2 + 0x49);
                                              puVar7[3] = uVar5;
                                              *puVar7 = uVar3;
                                              puVar7[1] = uVar4;
                                              *(undefined4 *)
                                               (CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               0x20) = 0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)0x0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)0x0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)0x0;
                                              tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)CONCAT44(tx2_1.vin.
                                                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,10)
                                              ;
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::emplace_back<int>(&witness.stack,(int *)&tx2_1);
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::operator=((
                                                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)(CONCAT71(tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  0x50),&witness.stack);
                                              for (uVar44 = 0;
                                                  uVar44 < (ulong)(local_410.field2 -
                                                                   (long)local_418 >> 3);
                                                  uVar44 = uVar44 + 1) {
                                                tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                                     (pointer)0x0;
                                                tx2_1.vout.
                                                super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                                _M_impl.super__Vector_impl_data._M_start =
                                                     (pointer)0x0;
                                                tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start =
                                                     (pointer)0x0;
                                                tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_finish =
                                                     (pointer)0x0;
                                                this_04 = CScript::operator<<((CScript *)&tx2_1,
                                                                              OP_11);
                                                other = &CScript::operator<<(this_04,OP_EQUAL)->
                                                         super_CScriptBase;
                                                prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                                operator=((
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )(CONCAT71(tx1_1.vout.
                                                                                                                          
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  lVar36),other);
                                                prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                                ~prevector((
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )&tx2_1);
                                                *(undefined8 *)
                                                 (CONCAT71(tx1_1.vout.
                                                                                                                      
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  -8 + lVar36) =
                                                     *(undefined8 *)(local_418.field2 + uVar44 * 8);
                                                lVar36 = lVar36 + 0x28;
                                              }
                                              CMutableTransaction::CMutableTransaction
                                                        (&tx2_1,&tx1_1);
                                              ((tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->prevout).
                                              n = 1;
                                              std::
                                              make_shared<CTransaction_const,CMutableTransaction&>
                                                        ((CMutableTransaction *)&local_438._M_value)
                                              ;
                                              std::
                                              make_shared<CTransaction_const,CMutableTransaction&>
                                                        ((CMutableTransaction *)local_468);
                                              local_3d8 = local_438;
                                              p_Stack_3d0 = a_Stack_430[0]._M_pi;
                                              local_438 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x0;
                                              a_Stack_430[0]._M_pi =
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   0x0;
                                              CStack_3c8.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr = (element_type *)local_468._0_8_;
                                              CStack_3c8.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi =
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_468._8_8_;
                                              local_468._0_8_ = (element_type *)0x0;
                                              local_468._8_8_ =
                                                   (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)0x0;
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_468 + 8));
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count(a_Stack_430);
                                              CMutableTransaction::~CMutableTransaction(&tx2_1);
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::~vector(&witness.stack);
                                              CMutableTransaction::~CMutableTransaction(&tx1_1);
                                              std::_Vector_base<long,_std::allocator<long>_>::
                                              ~_Vector_base((
                                                  _Vector_base<long,_std::allocator<long>_> *)
                                                  &local_418._M_value);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count(&local_c0);
                                              TestMemPoolEntryHelper::FromTx
                                                        ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                         (CTransactionRef *)&local_3d8._M_value);
                                              CTxMemPool::addUnchecked
                                                        (this_00,(CTxMemPoolEntry *)&tx1_1);
                                              CTxMemPoolEntry::~CTxMemPoolEntry
                                                        ((CTxMemPoolEntry *)&tx1_1);
                                              TestMemPoolEntryHelper::FromTx
                                                        ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                         &CStack_3c8);
                                              CTxMemPool::addUnchecked
                                                        (this_00,(CTxMemPoolEntry *)&tx1_1);
                                              CTxMemPoolEntry::~CTxMemPoolEntry
                                                        ((CTxMemPoolEntry *)&tx1_1);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count(&local_1218._M_refcount);
                                              oVar45 = CTxMemPool::GetIter(this_00,(uint256 *)
                                                                                   (local_3d8.field2
                                                                                   + 0x39));
                                              if (((undefined1  [16])
                                                   oVar45.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                              {
                                                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                  std::__throw_bad_optional_access();
                                                }
                                              }
                                              else {
                                                oVar46 = CTxMemPool::GetIter(this_00,&((CStack_3c8.
                                                                                                                                                                                
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                                                if (((undefined1  [16])
                                                     oVar46.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                                {
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                    std::__throw_bad_optional_access();
                                                  }
                                                }
                                                else {
                                                  local_1228 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1220 = "";
                                                  local_1249._17_8_ =
                                                       &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                                  local_1249._25_8_ =
                                                       &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                                  msg_59.m_end = (iterator)pTVar42;
                                                  msg_59.m_begin = pvVar38;
                                                  file_59.m_end = (iterator)0x15e;
                                                  file_59.m_begin = (iterator)&local_1228;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_59,
                                                             (size_t)(local_1249 + 0x11),msg_59);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)tx2_1.vin.
                                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_01139f30;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  tx2_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0xc694e1;
                                                  local_1249._1_8_ =
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1249._9_8_ = "";
                                                  pbVar35 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1249;
                                                  __l_67._M_len = 1;
                                                  __l_67._M_array = (iterator)&local_d0;
                                                  local_d0 = oVar45.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload;
                                                  std::
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_67,
                                                  (CompareIteratorByHash *)&local_469,
                                                  (allocator_type *)pbVar35);
                                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                            ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_00,(setEntries *)&tx1_1);
                                                  if (entry_1.spendsCoinbase == false) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    std::
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_468,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar45.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_418._M_value,
                                                             (base_blob<256u> *)
                                                             (local_468._0_8_ + 0x39));
                                                  std::
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_c8._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar54.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_438._M_value,
                                                             (base_blob<256u> *)
                                                             (local_c8.field2 + 0x39));
                                                  tinyformat::
                                                  format<std::__cxx11::string,std::__cxx11::string>
                                                            ((string *)&witness,
                                                             (tinyformat *)
                                                             "%s is not the only child of parent %s"
                                                             ,(char *)&local_418,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_438._M_value,pbVar35);
                                                  pvVar38 = (iterator)0x2;
                                                  pTVar42 = &entry_1;
                                                  boost::test_tools::tt_detail::
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                            (&tx2_1,local_1249 + 1,0x15e,1,2,pTVar42
                                                             ,
                                                  "pool.CheckConflictTopology({entry_sibling_1}).value()"
                                                  ,(string *)&witness,
                                                  "tfm::format(\"%s is not the only child of parent %s\", entry_sibling_1->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString())"
                                                  );
                                                  std::__cxx11::string::~string((string *)&witness);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_438._M_value);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_418._M_value);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_468 + 8));
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset((
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            ((_Rb_tree<_270907ca_> *)&tx1_1);
                                                  local_1260 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1258 = "";
                                                  local_1270 = &boost::unit_test::
                                                                basic_cstring<char_const>::null;
                                                  local_1268 = &boost::unit_test::
                                                                basic_cstring<char_const>::null;
                                                  msg_60.m_end = (iterator)pTVar42;
                                                  msg_60.m_begin = pvVar38;
                                                  file_60.m_end = (iterator)0x15f;
                                                  file_60.m_begin = (iterator)&local_1260;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_60,
                                                             (size_t)&local_1270,msg_60);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)tx2_1.vin.
                                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_01139f30;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  tx2_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0xc694e1;
                                                  local_1280 = 
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1278 = "";
                                                  pbVar35 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1249;
                                                  __l_68._M_len = 1;
                                                  __l_68._M_array = (iterator)&local_d0;
                                                  local_d0 = oVar46.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload;
                                                  std::
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_68,
                                                  (CompareIteratorByHash *)&local_469,
                                                  (allocator_type *)pbVar35);
                                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                            ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_00,(setEntries *)&tx1_1);
                                                  if (entry_1.spendsCoinbase == false) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    std::
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_468,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar46.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_418._M_value,
                                                             (base_blob<256u> *)
                                                             (local_468._0_8_ + 0x39));
                                                  std::
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&local_c8._M_value,
                                                  (
                                                  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  *)oVar54.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload);
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_438._M_value,
                                                             (base_blob<256u> *)
                                                             (local_c8.field2 + 0x39));
                                                  tinyformat::
                                                  format<std::__cxx11::string,std::__cxx11::string>
                                                            ((string *)&witness,
                                                             (tinyformat *)
                                                             "%s is not the only child of parent %s"
                                                             ,(char *)&local_418,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_438._M_value,pbVar35);
                                                  boost::test_tools::tt_detail::
                                                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                                                            (&tx2_1,&local_1280,0x15f,1,2,&entry_1,
                                                                                                                          
                                                  "pool.CheckConflictTopology({entry_sibling_2}).value()"
                                                  ,(string *)&witness,
                                                  "tfm::format(\"%s is not the only child of parent %s\", entry_sibling_2->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString())"
                                                  );
                                                  std::__cxx11::string::~string((string *)&witness);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_438._M_value);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_c0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_418._M_value);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_468 + 8));
                                                  std::
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::_M_reset((
                                                  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            ((_Rb_tree<_270907ca_> *)&tx1_1);
                                                  std::
                                                  pair<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>_>
                                                  ::~pair((
                                                  pair<std::shared_ptr<const_CTransaction>,_std::shared_ptr<const_CTransaction>_>
                                                  *)&local_3d8._M_value);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&two_parent_child_tx.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&grand_child_tx.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&spends_conflicting_confirmed.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&spends_new_unconfirmed.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&spends_unconfirmed.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_conflicts._M_t);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&conflicts_with_parents.
                                                                                                                                      
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::
                                                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                  ::~vector(&parent_inputs);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_children._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_parents._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&empty_set._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_entries._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_78_high._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_56_low._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_34_cpfp._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_12_normal._M_t);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx5.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx4.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx3.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx2.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&tx1.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::unique_lock<std::recursive_mutex>::
                                                  ~unique_lock(&criticalblock2.super_unique_lock);
                                                  std::unique_lock<std::recursive_mutex>::
                                                  ~unique_lock(&criticalblock1.super_unique_lock);
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                                                    return;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(rbf_helper_functions, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    const CAmount low_fee{CENT/100};
    const CAmount normal_fee{CENT/10};
    const CAmount high_fee{CENT};

    // Create a parent tx1 and child tx2 with normal fees:
    const auto tx1 = make_tx(/*inputs=*/ {m_coinbase_txns[0]}, /*output_values=*/ {10 * COIN});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx1));
    const auto tx2 = make_tx(/*inputs=*/ {tx1}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx2));

    // Create a low-feerate parent tx3 and high-feerate child tx4 (cpfp)
    const auto tx3 = make_tx(/*inputs=*/ {m_coinbase_txns[1]}, /*output_values=*/ {1099 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx3));
    const auto tx4 = make_tx(/*inputs=*/ {tx3}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx4));

    // Create a parent tx5 and child tx6 where both have very low fees
    const auto tx5 = make_tx(/*inputs=*/ {m_coinbase_txns[2]}, /*output_values=*/ {1099 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const auto tx6 = make_tx(/*inputs=*/ {tx5}, /*output_values=*/ {1098 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx6));
    // Make tx6's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx6->GetHash(), 1 * COIN);

    // Two independent high-feerate transactions, tx7 and tx8
    const auto tx7 = make_tx(/*inputs=*/ {m_coinbase_txns[3]}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx7));
    const auto tx8 = make_tx(/*inputs=*/ {m_coinbase_txns[4]}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx8));

    // Normal txs, will chain txns right before CheckConflictTopology test
    const auto tx9 = make_tx(/*inputs=*/ {m_coinbase_txns[5]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx9));
    const auto tx10 = make_tx(/*inputs=*/ {m_coinbase_txns[6]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx10));

    // Will make these two parents of single child
    const auto tx11 = make_tx(/*inputs=*/ {m_coinbase_txns[7]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx11));
    const auto tx12 = make_tx(/*inputs=*/ {m_coinbase_txns[8]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx12));

    // Will make two children of this single parent
    const auto tx13 = make_tx(/*inputs=*/ {m_coinbase_txns[9]}, /*output_values=*/ {995 * CENT, 995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx13));

    const auto entry1_normal = pool.GetIter(tx1->GetHash()).value();
    const auto entry2_normal = pool.GetIter(tx2->GetHash()).value();
    const auto entry3_low = pool.GetIter(tx3->GetHash()).value();
    const auto entry4_high = pool.GetIter(tx4->GetHash()).value();
    const auto entry5_low = pool.GetIter(tx5->GetHash()).value();
    const auto entry6_low_prioritised = pool.GetIter(tx6->GetHash()).value();
    const auto entry7_high = pool.GetIter(tx7->GetHash()).value();
    const auto entry8_high = pool.GetIter(tx8->GetHash()).value();
    const auto entry9_unchained = pool.GetIter(tx9->GetHash()).value();
    const auto entry10_unchained = pool.GetIter(tx10->GetHash()).value();
    const auto entry11_unchained = pool.GetIter(tx11->GetHash()).value();
    const auto entry12_unchained = pool.GetIter(tx12->GetHash()).value();
    const auto entry13_unchained = pool.GetIter(tx13->GetHash()).value();

    BOOST_CHECK_EQUAL(entry1_normal->GetFee(), normal_fee);
    BOOST_CHECK_EQUAL(entry2_normal->GetFee(), normal_fee);
    BOOST_CHECK_EQUAL(entry3_low->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry4_high->GetFee(), high_fee);
    BOOST_CHECK_EQUAL(entry5_low->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry6_low_prioritised->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry7_high->GetFee(), high_fee);
    BOOST_CHECK_EQUAL(entry8_high->GetFee(), high_fee);

    CTxMemPool::setEntries set_12_normal{entry1_normal, entry2_normal};
    CTxMemPool::setEntries set_34_cpfp{entry3_low, entry4_high};
    CTxMemPool::setEntries set_56_low{entry5_low, entry6_low_prioritised};
    CTxMemPool::setEntries set_78_high{entry7_high, entry8_high};
    CTxMemPool::setEntries all_entries{entry1_normal, entry2_normal, entry3_low, entry4_high,
                                       entry5_low, entry6_low_prioritised, entry7_high, entry8_high};
    CTxMemPool::setEntries empty_set;

    const auto unused_txid{GetRandHash()};

    // Tests for PaysMoreThanConflicts
    // These tests use feerate, not absolute fee.
    BOOST_CHECK(PaysMoreThanConflicts(/*iters_conflicting=*/set_12_normal,
                                      /*replacement_feerate=*/CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize() + 2),
                                      /*txid=*/unused_txid).has_value());
    // Replacement must be strictly greater than the originals.
    BOOST_CHECK(PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee(), entry1_normal->GetTxSize()), unused_txid).has_value());
    BOOST_CHECK(PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize()), unused_txid) == std::nullopt);
    // These tests use modified fees (including prioritisation), not base fees.
    BOOST_CHECK(PaysMoreThanConflicts({entry5_low}, CFeeRate(entry5_low->GetModifiedFee() + 1, entry5_low->GetTxSize()), unused_txid) == std::nullopt);
    BOOST_CHECK(PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid).has_value());
    BOOST_CHECK(PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetModifiedFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid) == std::nullopt);
    // PaysMoreThanConflicts checks individual feerate, not ancestor feerate. This test compares
    // replacement_feerate and entry4_high's feerate, which are the same. The replacement_feerate is
    // considered too low even though entry4_high has a low ancestor feerate.
    BOOST_CHECK(PaysMoreThanConflicts(set_34_cpfp, CFeeRate(entry4_high->GetModifiedFee(), entry4_high->GetTxSize()), unused_txid).has_value());

    // Tests for EntriesAndTxidsDisjoint
    BOOST_CHECK(EntriesAndTxidsDisjoint(empty_set, {tx1->GetHash()}, unused_txid) == std::nullopt);
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx3->GetHash()}, unused_txid) == std::nullopt);
    BOOST_CHECK(EntriesAndTxidsDisjoint({entry2_normal}, {tx2->GetHash()}, unused_txid).has_value());
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx1->GetHash()}, unused_txid).has_value());
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx2->GetHash()}, unused_txid).has_value());
    // EntriesAndTxidsDisjoint does not calculate descendants of iters_conflicting; it uses whatever
    // the caller passed in. As such, no error is returned even though entry2_normal is a descendant of tx1.
    BOOST_CHECK(EntriesAndTxidsDisjoint({entry2_normal}, {tx1->GetHash()}, unused_txid) == std::nullopt);

    // Tests for PaysForRBF
    const CFeeRate incremental_relay_feerate{DEFAULT_INCREMENTAL_RELAY_FEE};
    const CFeeRate higher_relay_feerate{2 * DEFAULT_INCREMENTAL_RELAY_FEE};
    // Must pay at least as much as the original.
    BOOST_CHECK(PaysForRBF(/*original_fees=*/high_fee,
                           /*replacement_fees=*/high_fee,
                           /*replacement_vsize=*/1,
                           /*relay_fee=*/CFeeRate(0),
                           /*txid=*/unused_txid)
                           == std::nullopt);
    BOOST_CHECK(PaysForRBF(high_fee, high_fee - 1, 1, CFeeRate(0), unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee + 1, high_fee, 1, CFeeRate(0), unused_txid).has_value());
    // Additional fees must cover the replacement's vsize at incremental relay fee
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 1, 2, incremental_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 2, 2, incremental_relay_feerate, unused_txid) == std::nullopt);
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 2, 2, higher_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 4, 2, higher_relay_feerate, unused_txid) == std::nullopt);
    BOOST_CHECK(PaysForRBF(low_fee, high_fee, 99999999, incremental_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(low_fee, high_fee + 99999999, 99999999, incremental_relay_feerate, unused_txid) == std::nullopt);

    // Tests for GetEntriesForConflicts
    CTxMemPool::setEntries all_parents{entry1_normal, entry3_low, entry5_low, entry7_high, entry8_high};
    CTxMemPool::setEntries all_children{entry2_normal, entry4_high, entry6_low_prioritised};
    const std::vector<CTransactionRef> parent_inputs({m_coinbase_txns[0], m_coinbase_txns[1], m_coinbase_txns[2],
                                                m_coinbase_txns[3], m_coinbase_txns[4]});
    const auto conflicts_with_parents = make_tx(parent_inputs, {50 * CENT});
    CTxMemPool::setEntries all_conflicts;
    BOOST_CHECK(GetEntriesForConflicts(/*tx=*/ *conflicts_with_parents.get(),
                                       /*pool=*/ pool,
                                       /*iters_conflicting=*/ all_parents,
                                       /*all_conflicts=*/ all_conflicts) == std::nullopt);
    BOOST_CHECK(all_conflicts == all_entries);
    auto conflicts_size = all_conflicts.size();
    all_conflicts.clear();

    add_descendants(tx2, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx4, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx6, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx7, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    BOOST_CHECK_EQUAL(all_conflicts.size(), 100);
    all_conflicts.clear();

    // Exceeds maximum number of conflicts.
    add_descendants(tx8, 1, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts).has_value());

    // Tests for HasNoNewUnconfirmed
    const auto spends_unconfirmed = make_tx({tx1}, {36 * CENT});
    for (const auto& input : spends_unconfirmed->vin) {
        // Spends unconfirmed inputs.
        BOOST_CHECK(pool.exists(GenTxid::Txid(input.prevout.hash)));
    }
    BOOST_CHECK(HasNoNewUnconfirmed(/*tx=*/ *spends_unconfirmed.get(),
                                    /*pool=*/ pool,
                                    /*iters_conflicting=*/ all_entries) == std::nullopt);
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_unconfirmed.get(), pool, {entry2_normal}) == std::nullopt);
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_unconfirmed.get(), pool, empty_set).has_value());

    const auto spends_new_unconfirmed = make_tx({tx1, tx8}, {36 * CENT});
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_new_unconfirmed.get(), pool, {entry2_normal}).has_value());
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_new_unconfirmed.get(), pool, all_entries).has_value());

    const auto spends_conflicting_confirmed = make_tx({m_coinbase_txns[0], m_coinbase_txns[1]}, {45 * CENT});
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_conflicting_confirmed.get(), pool, {entry1_normal, entry3_low}) == std::nullopt);

    // Tests for CheckConflictTopology

    // Tx4 has 23 descendants
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology(set_34_cpfp).value(), strprintf("%s has 23 descendants, max 1 allowed", entry4_high->GetSharedTx()->GetHash().ToString()));

    // No descendants yet
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained}) == std::nullopt);

    // Add 1 descendant, still ok
    add_descendants(tx9, 1, pool);
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained}) == std::nullopt);

    // N direct conflicts; ok
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}) == std::nullopt);

    // Add 1 descendant, still ok, even if it's considered a direct conflict as well
    const auto child_tx = add_descendants(tx10, 1, pool);
    const auto entry10_child = pool.GetIter(child_tx->GetHash()).value();
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}) == std::nullopt);
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained, entry10_child}) == std::nullopt);

    // One more, size 3 cluster too much
    const auto grand_child_tx = add_descendants(child_tx, 1, pool);
    const auto entry10_grand_child = pool.GetIter(grand_child_tx->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}).value(), strprintf("%s has 2 descendants, max 1 allowed", entry10_unchained->GetSharedTx()->GetHash().ToString()));
    // even if direct conflict is descendent itself
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry9_unchained, entry10_grand_child, entry11_unchained}).value(), strprintf("%s has 2 ancestors, max 1 allowed", entry10_grand_child->GetSharedTx()->GetHash().ToString()));

    // Make a single child from two singleton parents
    const auto two_parent_child_tx = add_descendant_to_parents({tx11, tx12}, pool);
    const auto entry_two_parent_child = pool.GetIter(two_parent_child_tx->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry11_unchained}).value(), strprintf("%s is not the only parent of child %s", entry11_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry12_unchained}).value(), strprintf("%s is not the only parent of child %s", entry12_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_two_parent_child}).value(), strprintf("%s has 2 ancestors, max 1 allowed", entry_two_parent_child->GetSharedTx()->GetHash().ToString()));

    // Single parent with two children, we will conflict with the siblings directly only
    const auto two_siblings = add_children_to_parent(tx13, pool);
    const auto entry_sibling_1 = pool.GetIter(two_siblings.first->GetHash()).value();
    const auto entry_sibling_2 = pool.GetIter(two_siblings.second->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_sibling_1}).value(), strprintf("%s is not the only child of parent %s", entry_sibling_1->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_sibling_2}).value(), strprintf("%s is not the only child of parent %s", entry_sibling_2->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString()));

}